

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O3

void plutovg_color_init_hsla(plutovg_color_t *color,float h,float s,float l,float a)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  float fVar13;
  undefined1 auVar15 [16];
  uint uVar12;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar14 [16];
  
  fVar6 = fmodf(h,360.0);
  fVar10 = (float)(~-(uint)(fVar6 < 0.0) & (uint)fVar6 |
                  (uint)(fVar6 + 360.0) & -(uint)(fVar6 < 0.0)) / 30.0;
  fVar6 = fmodf(fVar10 + 0.0,12.0);
  fVar7 = fmodf(fVar10 + 8.0,12.0);
  auVar11._0_4_ = fVar7 + -3.0;
  auVar11._4_4_ = fVar6 + -3.0;
  auVar11._8_4_ = extraout_XMM0_Db_00 + 0.0;
  auVar11._12_4_ = extraout_XMM0_Db + 0.0;
  auVar9._0_4_ = 9.0 - fVar7;
  auVar9._4_4_ = 9.0 - fVar6;
  auVar9._8_4_ = 0.0 - extraout_XMM0_Db_00;
  auVar9._12_4_ = 0.0 - extraout_XMM0_Db;
  auVar11 = minps(auVar11,auVar9);
  fVar6 = auVar11._0_4_;
  fVar7 = auVar11._4_4_;
  iVar4 = -(uint)(1.0 < fVar6);
  iVar5 = -(uint)(1.0 < fVar7);
  auVar15._4_4_ = iVar5;
  auVar15._0_4_ = iVar4;
  auVar15._8_4_ = iVar5;
  auVar15._12_4_ = iVar5;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._4_4_ = iVar4;
  auVar14._0_4_ = iVar4;
  uVar2 = movmskpd(extraout_EAX,auVar14);
  uVar12 = 0x3f800000;
  bVar3 = (uVar2 & 2) == 0;
  if (bVar3) {
    uVar12 = 0xbf800000;
  }
  fVar18 = (float)(~-(uint)(fVar7 < -1.0) & 0x3f800000 | uVar12 & -(uint)(fVar7 < -1.0));
  fVar17 = fVar18;
  if (bVar3) {
    fVar17 = fVar7;
  }
  if (-1.0 <= fVar7) {
    fVar18 = fVar17;
  }
  fVar7 = l;
  if (1.0 - l <= l) {
    fVar7 = 1.0 - l;
  }
  auVar8 = ZEXT812(0x3f800000);
  bVar3 = (uVar2 & 1) == 0;
  if (bVar3) {
    auVar8 = ZEXT812(0xbf800000);
  }
  auVar16._0_4_ = auVar8._0_4_ & -(uint)(fVar6 < -1.0);
  auVar16._4_4_ = 0;
  auVar16._8_4_ = auVar8._8_4_ & auVar11._8_4_;
  auVar16._12_4_ = 0;
  auVar16 = ZEXT416(~-(uint)(fVar6 < -1.0) & 0x3f800000) | auVar16;
  auVar9 = auVar16;
  if (bVar3) {
    auVar9 = auVar11;
  }
  fVar17 = -fVar7 * s;
  fVar7 = auVar16._0_4_;
  if (-1.0 <= fVar6) {
    fVar7 = auVar9._0_4_;
  }
  fVar10 = fmodf(fVar10 + 4.0,12.0);
  fVar6 = fVar10 + -3.0;
  if (9.0 - fVar10 <= fVar10 + -3.0) {
    fVar6 = 9.0 - fVar10;
  }
  fVar10 = (float)(~-(uint)(fVar6 < -1.0) & 0x3f800000 |
                  (~-(uint)(1.0 < fVar6) & 0xbf800000 | -(uint)(1.0 < fVar6) & 0x3f800000) &
                  -(uint)(fVar6 < -1.0));
  fVar13 = fVar10;
  if (fVar6 <= 1.0) {
    fVar13 = fVar6;
  }
  fVar18 = fVar18 * fVar17 + l;
  fVar7 = fVar7 * fVar17 + l;
  if (-1.0 <= fVar6) {
    fVar10 = fVar13;
  }
  fVar6 = fVar17 * fVar10 + l;
  auVar1._4_4_ = fVar7;
  auVar1._0_4_ = fVar18;
  auVar1._8_4_ = fVar6;
  auVar1._12_4_ = a;
  auVar11 = minps(_DAT_00122800,auVar1);
  color->r = (float)(-(uint)(0.0 <= fVar18) & auVar11._0_4_);
  color->g = (float)(-(uint)(0.0 <= fVar7) & auVar11._4_4_);
  color->b = (float)(-(uint)(0.0 <= fVar6) & auVar11._8_4_);
  color->a = (float)(-(uint)(0.0 <= a) & auVar11._12_4_);
  return;
}

Assistant:

void plutovg_color_init_hsla(plutovg_color_t* color, float h, float s, float l, float a)
{
    h = fmodf(h, 360.f);
    if(h < 0.f) { h += 360.f; }

    float r = hsl_component(h, s, l, 0);
    float g = hsl_component(h, s, l, 8);
    float b = hsl_component(h, s, l, 4);
    plutovg_color_init_rgba(color, r, g, b, a);
}